

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void wiener_filter_stripe_highbd
               (RestorationUnitInfo *rui,int stripe_width,int stripe_height,int procunit_width,
               uint8_t *src8,int src_stride,uint8_t *dst8,int dst_stride,int32_t *tmpbuf,
               int bit_depth,aom_internal_error_info *error_info)

{
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000020;
  uint8_t *dst8_p;
  uint8_t *src8_p;
  int w;
  int j;
  WienerConvolveParams conv_params;
  uint local_64;
  int local_48;
  WienerConvolveParams local_44;
  int local_3c;
  long local_38;
  uint local_2c;
  int local_28;
  int local_24;
  long local_20;
  
  local_3c = in_R9D;
  local_38 = in_R8;
  local_2c = in_ECX;
  local_28 = in_EDX;
  local_24 = in_ESI;
  local_20 = in_RDI;
  local_44 = get_conv_params_wiener(in_stack_00000020);
  for (local_48 = 0; local_48 < local_24; local_48 = local_2c + local_48) {
    if ((int)local_2c < (int)((local_24 - local_48) + 0xfU & 0xfffffff0)) {
      local_64 = local_2c;
    }
    else {
      local_64 = (local_24 - local_48) + 0xfU & 0xfffffff0;
    }
    (*av1_highbd_wiener_convolve_add_src)
              ((uint8_t *)(local_38 + local_48),(long)local_3c,
               (uint8_t *)(in_stack_00000008 + local_48),(long)in_stack_00000010,
               (int16_t *)(local_20 + 0x20),0x10,(int16_t *)(local_20 + 0x10),0x10,local_64,local_28
               ,&local_44,in_stack_00000020);
  }
  return;
}

Assistant:

static void wiener_filter_stripe_highbd(
    const RestorationUnitInfo *rui, int stripe_width, int stripe_height,
    int procunit_width, const uint8_t *src8, int src_stride, uint8_t *dst8,
    int dst_stride, int32_t *tmpbuf, int bit_depth,
    struct aom_internal_error_info *error_info) {
  (void)tmpbuf;
  (void)error_info;
  const WienerConvolveParams conv_params = get_conv_params_wiener(bit_depth);

  for (int j = 0; j < stripe_width; j += procunit_width) {
    int w = AOMMIN(procunit_width, (stripe_width - j + 15) & ~15);
    const uint8_t *src8_p = src8 + j;
    uint8_t *dst8_p = dst8 + j;
    av1_highbd_wiener_convolve_add_src(src8_p, src_stride, dst8_p, dst_stride,
                                       rui->wiener_info.hfilter, 16,
                                       rui->wiener_info.vfilter, 16, w,
                                       stripe_height, &conv_params, bit_depth);
  }
}